

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O1

bool __thiscall
clickhouse::ColumnString::Load(ColumnString *this,CodedInputStream *input,size_t rows)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  string s;
  uint64_t len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  ulong local_40;
  long local_38;
  
  bVar4 = rows == 0;
  if (!bVar4) {
    local_38 = -rows;
    uVar3 = 1;
    do {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      local_60._M_string_length = 0;
      local_60.field_2._M_local_buf[0] = '\0';
      bVar1 = CodedInputStream::ReadVarint64(input,&local_40);
      if ((bVar1) && (local_40 < 0x1000000)) {
        std::__cxx11::string::resize((ulong)&local_60,(char)local_40);
        bVar1 = CodedInputStream::ReadRaw(input,local_60._M_dataplus._M_p,local_40);
      }
      else {
        bVar1 = false;
      }
      if (bVar1 == false) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p == &local_60.field_2) {
          return bVar4;
        }
        operator_delete(local_60._M_dataplus._M_p,
                        CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                 local_60.field_2._M_local_buf[0]) + 1);
        return bVar4;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->data_,
                 &local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,
                        CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                 local_60.field_2._M_local_buf[0]) + 1);
      }
      if (bVar1 == false) {
        return bVar4;
      }
      bVar4 = rows <= uVar3;
      lVar2 = local_38 + uVar3;
      uVar3 = uVar3 + 1;
    } while (lVar2 != 0);
  }
  return bVar4;
}

Assistant:

bool ColumnString::Load(CodedInputStream* input, size_t rows) {
    for (size_t i = 0; i < rows; ++i) {
        std::string s;

        if (!WireFormat::ReadString(input, &s)) {
            return false;
        }

        data_.push_back(std::move(s));
    }

    return true;
}